

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyReplacePreformattedSpaces(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    if ((next->tag == (Dict *)0x0) || (next->tag->parser != prvTidyParsePre)) {
      if (next->content != (Node *)0x0) {
        prvTidyReplacePreformattedSpaces(doc,next->content);
      }
    }
    else {
      prvTidyNormalizeSpaces(doc->lexer,next->content);
    }
  }
  return;
}

Assistant:

void TY_(ReplacePreformattedSpaces)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->tag && node->tag->parser == TY_(ParsePre))
        {
            TY_(NormalizeSpaces)(doc->lexer, node->content);
            node = next;
            continue;
        }

        if (node->content)
            TY_(ReplacePreformattedSpaces)(doc, node->content);

        node = next;
    }
}